

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long *in_RDI;
  double dVar3;
  float max;
  float min;
  float slope;
  int i;
  float *m;
  float *w_1;
  int q;
  float sum;
  int p;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  Allocator *in_stack_ffffffffffffff28;
  Mat *this_00;
  size_t in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  float fVar4;
  float local_b4;
  int local_b0;
  Mat local_a0;
  float *local_60;
  float *local_58;
  int local_50;
  float local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  int local_4;
  
  if (((*(byte *)(in_RCX + 0x1a) & 1) == 0) || (in_RDI[0x24] != 1)) {
    local_2c = *(int *)(in_RSI + 0x2c);
    local_30 = *(int *)(in_RSI + 0x30);
    local_34 = *(int *)(in_RSI + 0x34);
    local_40 = *(undefined8 *)(in_RSI + 0x10);
    local_44 = local_2c * local_30;
    local_20 = in_RDX;
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_48 = 0; local_48 < (int)in_RDI[0x17]; local_48 = local_48 + 1) {
        local_4c = 0.0;
        if (*(int *)((long)in_RDI + 0xbc) != 0) {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x2a),(long)local_48);
          local_4c = *pfVar2;
        }
        for (local_50 = 0; local_50 < local_34; local_50 = local_50 + 1) {
          local_58 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x22));
          local_58 = local_58 + (long)(local_44 * local_34 * local_48) + (long)(local_44 * local_50)
          ;
          this_00 = &local_a0;
          Mat::channel(this_00,(int)in_stack_ffffffffffffff24);
          pfVar2 = Mat::operator_cast_to_float_(this_00);
          Mat::~Mat((Mat *)0x14f228);
          for (local_b0 = 0; local_b0 < local_44; local_b0 = local_b0 + 1) {
            local_4c = pfVar2[local_b0] * local_58[local_b0] + local_4c;
          }
          local_60 = pfVar2;
        }
        if ((int)in_RDI[0x19] == 1) {
          local_b4 = 0.0;
          pfVar2 = std::max<float>(&local_4c,&local_b4);
          local_4c = *pfVar2;
        }
        else if ((int)in_RDI[0x19] == 2) {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1a),0);
          in_stack_ffffffffffffff24 = local_4c;
          if (local_4c <= 0.0) {
            local_4c = local_4c * *pfVar2;
            in_stack_ffffffffffffff24 = local_4c;
          }
        }
        else if ((int)in_RDI[0x19] == 3) {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1a),0);
          fVar4 = *pfVar2;
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x1a),1);
          if (local_4c < fVar4) {
            local_4c = fVar4;
          }
          if (*pfVar2 < local_4c) {
            local_4c = *pfVar2;
          }
        }
        else if ((int)in_RDI[0x19] == 4) {
          dVar3 = std::exp((double)(ulong)(uint)-local_4c);
          local_4c = 1.0 / (SUB84(dVar3,0) + 1.0);
        }
        pfVar2 = Mat::operator[](local_20,(long)local_48);
        *pfVar2 = local_4c;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0x50))(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_4;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        if (activation_type == 1)
        {
            sum = std::max(sum, 0.f);
        }
        else if (activation_type == 2)
        {
            float slope = activation_params[0];
            sum = sum > 0.f ? sum : sum * slope;
        }
        else if (activation_type == 3)
        {
            float min = activation_params[0];
            float max = activation_params[1];
            if (sum < min)
                sum = min;
            if (sum > max)
                sum = max;
        }
        else if (activation_type == 4)
        {
            sum = static_cast<float>(1.f / (1.f + exp(-sum)));
        }

        top_blob[p] = sum;
    }

    return 0;
}